

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool GlobOpt::DoTypedArrayTypeSpec(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar2;
  FunctionJITTimeInfo *this;
  JITTimeProfileInfo *this_00;
  
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar2);
  this = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,TypedArrayTypeSpecPhase,sourceContextId,functionId);
  if ((!bVar1) && (bVar1 = IsTypeSpecPhaseOff(func), !bVar1)) {
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar2);
    if (!bVar1) {
      return true;
    }
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar2);
    bVar1 = JITTimeWorkItem::IsLoopBody(func->m_workItem);
    bVar1 = JITTimeProfileInfo::IsTypedArrayTypeSpecDisabled(this_00,bVar1);
    return !bVar1;
  }
  return false;
}

Assistant:

bool
GlobOpt::DoTypedArrayTypeSpec(Func const * func)
{
    return !PHASE_OFF(Js::TypedArrayTypeSpecPhase, func) &&
        !IsTypeSpecPhaseOff(func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsTypedArrayTypeSpecDisabled(func->IsLoopBody()))
#if defined(_M_IX86)
        && AutoSystemInfo::Data.SSE2Available()
#endif
        ;
}